

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O3

char * eread(char *fmt,char *buf,size_t nbuf,int flag,...)

{
  byte bVar1;
  char in_AL;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  buffer *pbVar8;
  list *plVar9;
  ulong uVar10;
  size_t sVar11;
  undefined1 *__ptr;
  line *plVar12;
  mgwin *pmVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  list *plVar19;
  int iVar20;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar21;
  uint uVar22;
  long lVar23;
  char *pcVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  buffer *pbVar28;
  int iVar29;
  bool bVar30;
  bool bVar31;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1a8 [32];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined1 local_f8 [8];
  va_list ap;
  ulong local_a0;
  size_t local_98;
  list *local_90;
  ulong local_88;
  ulong local_60;
  char *local_58;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  uint local_34;
  
  plVar12 = maclcur;
  ap[0].overflow_arg_area = local_1a8;
  if (in_AL != '\0') {
    local_178 = in_XMM0_Qa;
    local_168 = in_XMM1_Qa;
    local_158 = in_XMM2_Qa;
    local_148 = in_XMM3_Qa;
    local_138 = in_XMM4_Qa;
    local_128 = in_XMM5_Qa;
    local_118 = in_XMM6_Qa;
    local_108 = in_XMM7_Qa;
  }
  ap[0]._0_8_ = &stack0x00000008;
  local_f8._0_4_ = 0x20;
  local_f8._4_4_ = 0x30;
  local_188 = in_R8;
  local_180 = in_R9;
  if (inmacro == 0) {
    if (((flag & 8U) == 0) && (ttrow == nrow + -1)) {
      eputc(' ');
    }
    else {
      ttcolor(1);
      ttmove(nrow + -1,0);
      epresf = 1;
    }
    eformat(fmt,(__va_list_tag *)local_f8);
    local_40 = 0;
    if ((flag & 0x20U) != 0) {
      if (buf == (char *)0x0) {
        return (char *)0x0;
      }
      cVar2 = *buf;
      if (cVar2 != '\0') {
        pcVar17 = buf + 1;
        do {
          eputc(cVar2);
          cVar2 = *pcVar17;
          pcVar17 = pcVar17 + 1;
        } while (cVar2 != '\0');
      }
      local_40 = strlen(buf);
    }
    tteeol();
    ttflush();
    uVar3 = flag & 0x40;
    bVar14 = true;
    bVar31 = false;
    uVar22 = 0;
    local_a0 = 0;
    uVar16 = 0;
    local_48 = local_40 & 0xffffffff;
    local_98 = nbuf;
    local_58 = buf;
    local_34 = flag;
LAB_0010c2f5:
    do {
      iVar4 = getkey(0);
      iVar29 = tthue;
      iVar20 = ttcol;
      iVar5 = ttrow;
      if ((flag & 7U) == 0 || iVar4 != 9) {
LAB_0010c31f:
        iVar5 = (int)local_40;
LAB_0010c32c:
        while( true ) {
          flag = local_34;
          uVar21 = (uint)uVar16;
          uVar26 = (uint)local_40;
          uVar7 = (uint)local_48;
          if ((int)uVar21 < 1) break;
          bVar31 = true;
          bVar30 = (uint)local_a0 == uVar21;
          if (bVar30) {
            lVar23 = *(long *)(*(long *)(_cur_term + 0x20) + 0x278);
            iVar20 = (int)*(char *)(lVar23 + uVar16);
            local_a0 = uVar16;
            if ((iVar20 != 0) && (iVar4 == iVar20)) {
              local_a0 = uVar16 + 1;
              bVar31 = false;
              bVar30 = *(char *)(lVar23 + 1 + uVar16) == '\0';
              if (bVar30) {
                uVar21 = 0;
              }
              if (bVar30) {
                iVar4 = 2;
              }
            }
          }
          if (uVar22 == uVar21) {
            lVar23 = *(long *)(*(long *)(_cur_term + 0x20) + 0x298);
            cVar2 = *(char *)(lVar23 + (ulong)uVar22);
            if ((cVar2 == '\0') || (iVar4 != cVar2)) goto LAB_0010c3bb;
            uVar25 = uVar22 + 1;
            uVar21 = uVar22;
            if (*(char *)(lVar23 + 1 + (ulong)uVar22) == '\0') {
              uVar16 = 0;
              uVar22 = uVar22 + 1;
              goto LAB_0010ca4e;
            }
LAB_0010c402:
            uVar22 = uVar25;
            if (uVar21 != 0) {
              uVar16 = (ulong)(uVar21 + 1);
              goto LAB_0010c46c;
            }
            uVar16 = 0;
            break;
          }
LAB_0010c3bb:
          uVar25 = uVar22;
          if (!bVar31) goto LAB_0010c402;
          uVar7 = local_34 & 7;
          uVar16 = 0;
          iVar4 = getkey(0);
          flag = local_34;
          if (uVar7 != 0 && iVar4 == 9) goto LAB_0010cd23;
        }
        switch(iVar4) {
        case 1:
          if (0 < (int)uVar7) {
            uVar18 = (local_48 & 0xffffffff) + 1;
            do {
              if ((cinfo[(byte)local_58[uVar18 - 2]] & 8U) != 0) {
                ttputc(8);
                ttcol = ttcol + -1;
              }
              ttputc(8);
              ttcol = ttcol + -1;
              uVar18 = uVar18 - 1;
            } while (1 < uVar18);
            local_48 = 0;
          }
          goto LAB_0010ccd2;
        case 2:
          if ((int)uVar7 < 1) break;
          local_48 = (ulong)(uVar7 - 1);
          if ((cinfo[(byte)local_58[local_48]] & 8U) != 0) {
            ttputc(8);
            ttcol = ttcol + -1;
          }
          ttputc(8);
          ttcol = ttcol + -1;
          goto LAB_0010ccd2;
        case 3:
        case 9:
        case 0xc:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x16:
        case 0x1a:
          goto switchD_0010c42e_caseD_3;
        case 4:
          if ((uint)local_40 == uVar7) {
            local_40 = local_48;
          }
          else {
            tteeol();
            iVar20 = ttcol;
            iVar5 = ttrow;
            uVar18 = local_48;
            while (local_4c = uVar7, (int)uVar7 < (int)(uVar26 - 1)) {
              local_58[(int)uVar18] = local_58[(long)(int)uVar18 + 1];
              eputc(local_58[(int)uVar7]);
              uVar7 = uVar7 + 1;
              uVar18 = (ulong)uVar7;
            }
            local_40 = (ulong)(uVar26 - 1);
            ttmove(iVar5,iVar20);
            ttflush();
            flag = local_34;
          }
          break;
        case 5:
          iVar5 = (uint)local_40 - uVar7;
          if ((int)uVar7 < (int)(uint)local_40) {
            lVar23 = 0;
            do {
              eputc(local_58[lVar23 + (int)uVar7]);
              lVar23 = lVar23 + 1;
            } while (iVar5 != (int)lVar23);
            local_48 = local_40;
            flag = local_34;
          }
          goto LAB_0010ccd2;
        case 6:
LAB_0010ca4e:
          if ((int)uVar7 < (int)(uint)local_40) {
            local_48 = (ulong)(uVar7 + 1);
            eputc(local_58[(int)uVar7]);
            ttflush();
          }
          break;
        case 7:
          eputc('\a');
          local_58 = (char *)0x0;
          ctrlg(8,0);
          ttflush();
          goto LAB_0010d2dc;
        case 8:
switchD_0010c42e_caseD_8:
          if (uVar7 != 0) {
            bVar1 = local_58[(long)(int)uVar7 + -1];
            ttputc(8);
            iVar5 = ttcol + -1;
            if ((cinfo[bVar1] & 8U) != 0) {
              ttcol = iVar5;
              ttputc(8);
              iVar5 = ttcol + -1;
            }
            iVar20 = ttrow;
            uVar18 = (long)(int)uVar7 - 1;
            uVar26 = (int)local_40 - 1;
            local_4c = (uint)uVar18;
            ttcol = iVar5;
            if ((int)uVar7 < (int)local_40) {
              uVar10 = uVar18 & 0xffffffff;
              do {
                uVar7 = local_4c;
                local_58[(int)uVar10] = local_58[(long)(int)uVar10 + 1];
                eputc(local_58[(int)local_4c]);
                local_4c = uVar7 + 1;
                uVar10 = (ulong)local_4c;
              } while ((int)local_4c < (int)uVar26);
            }
            ttputc(0x20);
            if ((cinfo[bVar1] & 8U) != 0) {
              ttputc(0x20);
              ttputc(8);
            }
            ttputc(8);
            ttmove(iVar20,iVar5);
            ttflush();
            goto LAB_0010cb71;
          }
          goto LAB_0010c65e;
        case 10:
        case 0xd:
          if (iVar5 == 0 && uVar3 == 0) {
            ctrlg(8,0);
            ttflush();
            return (char *)0x0;
          }
          uVar7 = (uint)local_40;
          if ((local_34 & 1) == 0) {
LAB_0010d251:
            uVar16 = local_48;
            local_58[(int)uVar7] = '\0';
            if ((flag & 0x10U) != 0) {
              ttputc(0xd);
              ttflush();
            }
            if (macrodef != 0) {
              plVar12 = lalloc((int)uVar16);
              if (plVar12 == (line *)0x0) goto LAB_0010d323;
              plVar12->l_fp = maclcur->l_fp;
              maclcur->l_fp = plVar12;
              plVar12->l_bp = maclcur;
              maclcur = plVar12;
              memmove(plVar12->l_text,local_58,(long)(int)uVar16);
            }
LAB_0010d2dc:
            if (bVar14) {
              return local_58;
            }
            pbVar8 = bfind("*Completions*",1);
            pmVar13 = popbuf(pbVar8,1);
            if (pmVar13 != (mgwin *)0x0) {
              if ((pmVar13->w_flag & 1U) != 0) {
                curwp = pmVar13;
                delwind(8,1);
                return local_58;
              }
              killbuffer(pbVar8);
              return local_58;
            }
            return local_58;
          }
          iVar20 = complt(local_34,0xd,local_58,local_98,(uint)local_40,(int *)&local_4c);
          if (iVar20 != 0) {
            uVar22 = 0;
            if (0 < (int)local_4c) {
              uVar22 = local_4c;
            }
            uVar7 = uVar22 + (uint)local_40;
            goto LAB_0010d251;
          }
LAB_0010c46c:
          iVar4 = getkey(0);
          if ((flag & 7U) != 0 && iVar4 == 9) goto LAB_0010cd23;
          goto LAB_0010c32c;
        case 0xb:
          kdelete();
          local_4c = (uint)local_48;
          uVar7 = (uint)local_40;
          if ((int)local_4c < (int)uVar7) {
            pcVar17 = local_58 + (int)local_4c;
            do {
              uVar26 = local_4c + 1;
              kinsert((int)*pcVar17,1);
              pcVar17 = pcVar17 + 1;
              local_4c = uVar26;
            } while (uVar26 != uVar7);
          }
          tteeol();
          ttflush();
          local_40 = local_48;
          flag = local_34;
          break;
        case 0x11:
        case 0x1c:
          iVar4 = getkey(0);
          goto switchD_0010c42e_caseD_3;
        case 0x15:
        case 0x18:
          if (uVar7 != 0) {
            lVar23 = (long)(int)uVar7;
            do {
              ttputc(8);
              ttputc(0x20);
              ttputc(8);
              ttcol = ttcol + -1;
              if ((cinfo[(byte)local_58[lVar23 + -1]] & 8U) != 0) {
                ttputc(8);
                ttputc(0x20);
                ttputc(8);
                ttcol = ttcol + -1;
              }
              lVar23 = lVar23 + -1;
            } while (lVar23 != 0);
            local_40 = (ulong)((int)local_40 - (uint)local_48);
          }
          ttflush();
LAB_0010c65e:
          local_48 = 0;
          break;
        case 0x17:
          if ((int)uVar7 < 1) {
            local_60 = local_40 & 0xffffffff;
            goto LAB_0010ccf3;
          }
          uVar7 = (uint)local_40 - uVar7;
          uVar18 = local_48 & 0xffffffff;
          uVar10 = local_48;
          goto LAB_0010c9ac;
        case 0x19:
          local_4c = 1;
          iVar5 = kremove(0);
          if (iVar5 < 0) goto LAB_0010ccd2;
          iVar20 = (int)local_48;
          iVar29 = (int)local_40;
          local_48 = (ulong)iVar20;
          local_88 = local_48;
          goto LAB_0010c7e5;
        case 0x1b:
          uVar22 = 1;
          local_a0 = 1;
          uVar16 = 1;
          break;
        default:
          if (iVar4 == 0x7f) goto switchD_0010c42e_caseD_8;
switchD_0010c42e_caseD_3:
          uVar26 = (int)local_40 + 1;
          pcVar17 = local_58;
          if (buf == (char *)0x0) {
            if (local_98 <= (ulong)(long)(int)uVar26) {
              local_98 = (size_t)((int)local_40 * 2 + 0x10);
              pcVar17 = (char *)realloc(local_58,local_98);
              if (pcVar17 == (char *)0x0) goto LAB_0010d323;
            }
          }
          else if (local_98 <= (ulong)(long)(int)uVar26) goto LAB_0010c918;
          local_4c = (uint)local_40;
          iVar5 = (int)local_48;
          uVar18 = local_40;
          while (iVar5 < (int)local_4c) {
            pcVar17[(int)uVar18] = pcVar17[(long)(int)uVar18 + -1];
            local_4c = local_4c - 1;
            uVar18 = (ulong)local_4c;
          }
          uVar7 = iVar5 + 1;
          pcVar17[iVar5] = (char)iVar4;
          eputc((char)iVar4);
          iVar29 = ttcol;
          iVar20 = ttrow;
          iVar4 = (int)local_40;
          local_4c = uVar7;
          if (iVar5 < iVar4) {
            pcVar24 = pcVar17 + iVar5;
            uVar21 = iVar5 + 2;
            do {
              uVar25 = uVar21;
              pcVar24 = pcVar24 + 1;
              eputc(*pcVar24);
              uVar21 = uVar25 + 1;
              local_4c = uVar25;
            } while (uVar25 - iVar4 != 1);
          }
          ttmove(iVar20,iVar29);
          ttflush();
          uVar18 = (ulong)uVar7;
          local_58 = pcVar17;
LAB_0010cb71:
          local_40 = (ulong)uVar26;
          local_48 = uVar18 & 0xffffffff;
          flag = local_34;
        }
        goto LAB_0010ccfe;
      }
      if (!bVar31) goto LAB_0010cd23;
      ttflush();
      pbVar8 = bfind("*Completions*",1);
      iVar4 = bclear(pbVar8);
      bVar31 = true;
      bVar14 = false;
    } while (iVar4 == 0);
    pbVar8->b_flag = pbVar8->b_flag | 0x10;
    if ((flag & 2U) != 0) {
      if (bheadp != (buffer *)0x0) {
        plVar19 = (list *)0x0;
        pbVar28 = bheadp;
        do {
          plVar9 = (list *)malloc(0x10);
          if (plVar9 == (list *)0x0) goto joined_r0x0010ce8a;
          (plVar9->l_p).l_nxt = plVar19;
          pcVar17 = strdup((pbVar28->b_list).l_name);
          plVar9->l_name = pcVar17;
          pbVar28 = (buffer *)(pbVar28->b_list).l_p.l_wp;
          plVar19 = plVar9;
        } while (pbVar28 != (buffer *)0x0);
        iVar4 = 0;
        local_90 = plVar9;
        goto LAB_0010cf19;
      }
      goto LAB_0010cea8;
    }
    if ((flag & 1U) == 0) {
      if ((flag & 4U) == 0) {
        panic("broken complt call: flags");
      }
      local_58[(int)(uint)local_48] = '\0';
      plVar9 = make_file_list(local_58);
      pcVar17 = strrchr(local_58,0x2f);
      if (pcVar17 == (char *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = ((int)pcVar17 - (int)local_58) + 1;
      }
    }
    else {
      local_58[(int)(uint)local_48] = '\0';
      plVar9 = complete_function_list(local_58);
      iVar4 = 0;
    }
    local_90 = plVar9;
    if (plVar9 == (list *)0x0) {
      local_90 = (list *)0x0;
      bVar14 = true;
      iVar6 = 0;
    }
    else {
LAB_0010cf19:
      do {
        pmVar13 = (plVar9->l_p).l_wp;
        if (pmVar13 == (mgwin *)0x0) break;
        do {
          pcVar17 = plVar9->l_name;
          pcVar24 = (pmVar13->w_list).l_name;
          iVar6 = strcmp(pcVar17,pcVar24);
          if (0 < iVar6) {
            plVar9->l_name = pcVar24;
            (pmVar13->w_list).l_name = pcVar17;
          }
          pmVar13 = (pmVar13->w_list).l_p.l_wp;
        } while (pmVar13 != (mgwin *)0x0);
        plVar9 = (plVar9->l_p).l_nxt;
      } while (plVar9 != (list *)0x0);
      uVar18 = local_48 & 0xffffffff;
      iVar6 = 0;
      plVar19 = local_90;
      do {
        uVar10 = 0;
        if ((int)(uint)local_48 < 1) {
LAB_0010cf90:
          iVar15 = iVar6;
          if ((int)uVar10 == (uint)local_48) {
            pcVar17 = plVar19->l_name;
            goto LAB_0010cf9c;
          }
        }
        else {
          pcVar17 = plVar19->l_name;
          uVar10 = 0;
          do {
            if (local_58[uVar10] != pcVar17[uVar10]) goto LAB_0010cf90;
            uVar10 = uVar10 + 1;
          } while (uVar18 != uVar10);
LAB_0010cf9c:
          sVar11 = strlen(pcVar17);
          iVar15 = (int)sVar11;
          if ((int)sVar11 < iVar6) {
            iVar15 = iVar6;
          }
        }
        iVar6 = iVar15;
        plVar19 = (plVar19->l_p).l_nxt;
      } while (plVar19 != (list *)0x0);
      bVar14 = false;
      flag = local_34;
    }
    goto LAB_0010cfdc;
  }
  uVar16 = (ulong)maclcur->l_used;
  if (buf == (char *)0x0) {
    buf = (char *)malloc(uVar16 + 1);
    if (buf != (char *)0x0) goto LAB_0010d1e0;
  }
  else if (uVar16 < nbuf) {
LAB_0010d1e0:
    memmove(buf,plVar12->l_text,uVar16);
    buf[maclcur->l_used] = '\0';
    maclcur = maclcur->l_fp;
    return buf;
  }
  return (char *)0x0;
LAB_0010c7e5:
  do {
    local_88 = local_88 + 1;
    uVar7 = (uint)local_40;
    pcVar17 = local_58;
    uVar26 = uVar7;
    if (iVar5 == *curbp->b_nlchr) break;
    uVar26 = uVar7 + 1;
    if (buf == (char *)0x0) {
      if (local_98 <= (ulong)(long)(int)uVar26) {
        local_98 = (size_t)(int)(uVar7 * 2 + 0x10);
        pcVar17 = (char *)realloc(local_58,local_98);
        if (pcVar17 == (char *)0x0) {
LAB_0010d323:
          if ((buf == (char *)0x0) && (local_58 != (char *)0x0)) {
            free(local_58);
          }
          dobeep();
          ewprintf("Out of memory");
          return &veread_emptyval;
        }
      }
    }
    else if (local_98 <= (ulong)(long)(int)uVar26) goto LAB_0010c918;
    uVar18 = local_48;
    lVar27 = (long)(int)(uint)local_40;
    for (lVar23 = lVar27; (long)local_48 < lVar23; lVar23 = lVar23 + -1) {
      pcVar17[lVar23] = pcVar17[lVar23 + -1];
    }
    pcVar17[local_48] = (char)iVar5;
    eputc((char)iVar5);
    iVar5 = ttrow;
    local_40 = CONCAT44(local_40._4_4_,ttcol);
    if ((long)uVar18 < lVar27) {
      lVar23 = 0;
      do {
        eputc(pcVar17[lVar23 + local_88]);
        lVar23 = lVar23 + 1;
      } while (iVar29 - iVar20 != (int)lVar23);
    }
    local_48 = local_48 + 1;
    ttmove(iVar5,(uint)local_40);
    uVar7 = local_4c;
    local_4c = local_4c + 1;
    iVar5 = kremove(uVar7);
    local_40 = (ulong)uVar26;
    flag = local_34;
    local_58 = pcVar17;
  } while (-1 < iVar5);
  local_40 = (ulong)uVar26;
  local_58 = pcVar17;
LAB_0010ccd2:
  ttflush();
  goto LAB_0010ccfe;
  while( true ) {
    ttputc(8);
    ttputc(0x20);
    ttputc(8);
    ttcol = ttcol + -1;
    if ((cinfo[(byte)local_58[uVar18 - 1]] & 8U) != 0) {
      ttputc(8);
      ttputc(0x20);
      ttputc(8);
      ttcol = ttcol + -1;
    }
    local_40 = (ulong)((int)local_40 - 1);
    uVar10 = (ulong)((int)uVar10 - 1);
    bVar31 = uVar18 < 2;
    uVar18 = uVar18 - 1;
    if (bVar31) break;
LAB_0010c9ac:
    if ((cinfo[(byte)local_58[uVar18 - 1]] & 1U) != 0) {
      local_48 = uVar18;
      if ((long)uVar18 < 1) goto LAB_0010cceb;
      uVar7 = (int)local_40 - (int)uVar18;
      uVar18 = (uVar10 & 0xffffffff) + 1;
      goto LAB_0010cc12;
    }
  }
  goto LAB_0010cca9;
  while( true ) {
    ttputc(8);
    ttputc(0x20);
    ttputc(8);
    uVar10 = local_40;
    ttcol = ttcol + -1;
    if ((cinfo[(byte)local_58[uVar18 - 2]] & 8U) != 0) {
      ttputc(8);
      ttputc(0x20);
      ttputc(8);
      ttcol = ttcol + -1;
    }
    local_40 = (ulong)((int)uVar10 - 1);
    uVar10 = (ulong)((int)local_48 - 1);
    uVar18 = uVar18 - 1;
    if (uVar18 < 2) break;
LAB_0010cc12:
    local_48 = uVar10;
    if ((cinfo[(byte)local_58[uVar18 - 2]] & 1U) == 0) goto LAB_0010cceb;
  }
LAB_0010cca9:
  local_60 = (ulong)uVar7;
  local_48 = 0;
LAB_0010ccf3:
  flag = local_34;
  ttflush();
  local_40 = local_60;
LAB_0010ccfe:
  iVar4 = getkey(0);
  if ((flag & 7U) != 0 && iVar4 == 9) goto LAB_0010cd23;
  goto LAB_0010c31f;
LAB_0010cceb:
  local_60 = local_40 & 0xffffffff;
  goto LAB_0010ccf3;
LAB_0010c918:
  dobeep();
  ewprintf("Line too long. Press Control-g to escape.");
  goto LAB_0010ccfe;
LAB_0010cd23:
  uVar18 = local_40;
  iVar20 = (int)local_40;
  iVar5 = complt(flag,9,local_58,local_98,iVar20,(int *)&local_4c);
  uVar7 = local_4c + iVar20;
  bVar31 = iVar5 != 0;
  local_40 = uVar18 & 0xffffffff;
  if (bVar31) {
    local_40 = (ulong)uVar7;
  }
  if (!bVar31) {
    uVar7 = (uint)local_48;
  }
  local_48 = (ulong)uVar7;
  goto LAB_0010c2f5;
joined_r0x0010ce8a:
  while (plVar19 != (list *)0x0) {
    plVar9 = (plVar19->l_p).l_nxt;
    free(plVar19->l_name);
    free(plVar19);
    plVar19 = plVar9;
  }
LAB_0010cea8:
  bVar14 = true;
  local_90 = (list *)0x0;
  iVar4 = 0;
  iVar6 = 0;
  flag = local_34;
LAB_0010cfdc:
  iVar15 = (iVar6 - iVar4) + 1;
  iVar6 = ncol;
  if (ncol <= iVar15) {
    iVar6 = iVar15;
  }
  uVar7 = iVar6 + 1;
  __ptr = (undefined1 *)malloc((long)(int)uVar7);
  if (__ptr == (undefined1 *)0x0) {
    free_file_list(local_90);
    bVar14 = false;
  }
  else {
    *__ptr = 0;
    if (!bVar14) {
      uVar18 = local_48 & 0xffffffff;
      uVar26 = 0;
      plVar19 = local_90;
      do {
        uVar10 = 0;
        if ((int)(uint)local_48 < 1) {
LAB_0010d06b:
          if ((int)uVar10 == (uint)local_48) goto LAB_0010d074;
        }
        else {
          uVar10 = 0;
          do {
            if (local_58[uVar10] != plVar19->l_name[uVar10]) goto LAB_0010d06b;
            uVar10 = uVar10 + 1;
          } while (uVar18 != uVar10);
LAB_0010d074:
          if (ncol < (int)(uVar26 + iVar15)) {
            uVar26 = 0;
            addlinef(pbVar8,"%s",__ptr);
            *__ptr = 0;
          }
          uVar10 = strlcat(__ptr,plVar19->l_name + iVar4,(long)(int)uVar7);
          uVar26 = uVar26 + iVar15;
          flag = local_34;
          if ((uVar26 < uVar7) && (uVar10 < (ulong)(long)(int)uVar26)) {
            sVar11 = strlen(plVar19->l_name + iVar4);
            memset(__ptr + uVar10,0x20,(long)iVar15 - sVar11);
            __ptr[(int)uVar26] = 0;
            flag = local_34;
          }
        }
        plVar19 = (plVar19->l_p).l_nxt;
      } while (plVar19 != (list *)0x0);
      if (0 < (int)uVar26) {
        addlinef(pbVar8,"%s",__ptr);
      }
    }
    free(__ptr);
    free_file_list(local_90);
    popbuftop(pbVar8,1);
    update(2);
    ttmove(iVar5,iVar20);
    ttcolor(iVar29);
    ttflush();
    bVar14 = false;
  }
  goto LAB_0010c2f5;
}

Assistant:

char *
eread(const char *fmt, char *buf, size_t nbuf, int flag, ...)
{
	va_list	 ap;
	char	*rep;

	va_start(ap, flag);
	rep = veread(fmt, buf, nbuf, flag, ap);
	va_end(ap);
	return (rep);
}